

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O3

int __thiscall btHashString::portableStringCompare(btHashString *this,char *src,char *dst)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  
  bVar1 = *src;
  bVar3 = *dst;
  if (bVar3 != 0 && bVar1 == bVar3) {
    lVar5 = 1;
    do {
      bVar1 = src[lVar5];
      bVar3 = dst[lVar5];
      if (bVar1 != bVar3) break;
      lVar5 = lVar5 + 1;
    } while (bVar3 != 0);
  }
  iVar4 = 1;
  if (bVar1 == bVar3) {
    iVar4 = (uint)bVar1 - (uint)bVar3;
  }
  iVar2 = -1;
  if (-1 < (int)((uint)bVar1 - (uint)bVar3)) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int portableStringCompare(const char* src,	const char* dst) const
	{
			int ret = 0 ;

			while( ! (ret = *(unsigned char *)src - *(unsigned char *)dst) && *dst)
					++src, ++dst;

			if ( ret < 0 )
					ret = -1 ;
			else if ( ret > 0 )
					ret = 1 ;

			return( ret );
	}